

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::node::verify_token
          (node *this,string_view token,sha1_hash *info_hash,endpoint *addr)

{
  dht_observer *pdVar1;
  bool bVar2;
  size_type sVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  uint8_t *puVar6;
  sha1_hash local_12c;
  span<const_char> local_118;
  span<const_char> local_108;
  span<const_char> local_f8;
  hasher local_e8;
  hasher h2;
  undefined1 auStack_d8 [8];
  sha1_hash h;
  span<const_char> local_b0;
  span<const_char> local_a0 [2];
  address local_80;
  undefined1 local_60 [8];
  string address;
  hasher h1;
  endpoint *addr_local;
  sha1_hash *info_hash_local;
  node *this_local;
  string_view token_local;
  
  token_local._M_len = (size_t)token._M_str;
  this_local = (node *)token._M_len;
  sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar3 == 4) {
    lcrypto::hasher::hasher((hasher *)((long)&address.field_2 + 8));
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_80,addr);
    boost::asio::ip::address::to_string_abi_cxx11_((string *)local_60,&local_80);
    span<char_const>::span<std::__cxx11::string,char,void>
              ((span<char_const> *)local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    lcrypto::hasher::update((hasher *)((long)&address.field_2 + 8),local_a0[0]);
    span<char_const>::span<std::array<char,4ul>,char,void>
              ((span<char_const> *)&local_b0,this->m_secret);
    lcrypto::hasher::update((hasher *)((long)&address.field_2 + 8),local_b0);
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)(h.m_number._M_elems + 4),info_hash);
    lcrypto::hasher::update((hasher *)((long)&address.field_2 + 8),stack0xffffffffffffff40);
    lcrypto::hasher::final((sha1_hash *)auStack_d8,(hasher *)((long)&address.field_2 + 8));
    pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    puVar6 = digest32<160L>::operator[]((digest32<160L> *)auStack_d8,0);
    bVar2 = ::std::equal<char_const*,char*>(pvVar4,pvVar5,(char *)puVar6);
    if (bVar2) {
      token_local._M_str._7_1_ = 1;
      h2.m_context._4_4_ = 1;
    }
    else {
      lcrypto::hasher::hasher(&local_e8);
      span<char_const>::span<std::__cxx11::string,char,void>
                ((span<char_const> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      lcrypto::hasher::update(&local_e8,local_f8);
      span<char_const>::span<std::array<char,4ul>,char,void>
                ((span<char_const> *)&local_108,this->m_secret + 1);
      lcrypto::hasher::update(&local_e8,local_108);
      span<char_const>::span<libtorrent::digest32<160l>,char,void>
                ((span<char_const> *)&local_118,info_hash);
      lcrypto::hasher::update(&local_e8,local_118);
      lcrypto::hasher::final(&local_12c,&local_e8);
      h.m_number._M_elems[2] = local_12c.m_number._M_elems[4];
      auStack_d8._0_4_ = local_12c.m_number._M_elems[0];
      auStack_d8._4_4_ = local_12c.m_number._M_elems[1];
      h.m_number._M_elems[0] = local_12c.m_number._M_elems[2];
      h.m_number._M_elems[1] = local_12c.m_number._M_elems[3];
      pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pvVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      puVar6 = digest32<160L>::operator[]((digest32<160L> *)auStack_d8,0);
      token_local._M_str._7_1_ = ::std::equal<char_const*,char*>(pvVar4,pvVar5,(char *)puVar6);
      h2.m_context._4_4_ = 1;
      lcrypto::hasher::~hasher(&local_e8);
    }
    ::std::__cxx11::string::~string((string *)local_60);
    lcrypto::hasher::~hasher((hasher *)((long)&address.field_2 + 8));
  }
  else {
    if (this->m_observer != (dht_observer *)0x0) {
      pdVar1 = this->m_observer;
      sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"token of incorrect length: %d",sVar3 & 0xffffffff);
    }
    token_local._M_str._7_1_ = 0;
  }
  return (bool)(token_local._M_str._7_1_ & 1);
}

Assistant:

bool node::verify_token(string_view token, sha1_hash const& info_hash
	, udp::endpoint const& addr) const
{
	if (token.length() != write_token_size)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (m_observer != nullptr)
		{
			m_observer->log(dht_logger::node, "token of incorrect length: %d"
				, int(token.length()));
		}
#endif
		return false;
	}

	hasher h1;
	std::string const address = addr.address().to_string();
	h1.update(address);
	h1.update(m_secret[0]);
	h1.update(info_hash);

	sha1_hash h = h1.final();
	if (std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0])))
		return true;

	hasher h2;
	h2.update(address);
	h2.update(m_secret[1]);
	h2.update(info_hash);
	h = h2.final();
	return std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0]));
}